

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityOutputTest.cpp
# Opt level: O0

void __thiscall
TEST_TeamCityOutputTest_TestNameEscaped_Ignore_Test::
~TEST_TeamCityOutputTest_TestNameEscaped_Ignore_Test
          (TEST_TeamCityOutputTest_TestNameEscaped_Ignore_Test *this)

{
  TEST_TeamCityOutputTest_TestNameEscaped_Ignore_Test *this_local;
  
  ~TEST_TeamCityOutputTest_TestNameEscaped_Ignore_Test(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST(TeamCityOutputTest, TestNameEscaped_Ignore)
{
	IgnoredUtestShell itst("group", "'[]\n\r", "file", 10);
	result->currentTestStarted(&itst);
	const char* expected =
		"##teamcity[testStarted name='|'|[|]|n|r']\n"
		"##teamcity[testIgnored name='|'|[|]|n|r']\n";
	STRCMP_EQUAL(expected, mock->getOutput().asCharString());
}